

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_common.c
# Opt level: O0

void keyboard_default(mfb_window *window,mfb_key key,mfb_key_mod mod,_Bool isPressed)

{
  ulong uVar1;
  int in_ESI;
  long in_RDI;
  SWindowData *window_data;
  
  if ((in_ESI == 0x100) &&
     ((*(long *)(in_RDI + 0x20) == 0 ||
      (uVar1 = (**(code **)(in_RDI + 0x20))(in_RDI), (uVar1 & 1) != 0)))) {
    *(undefined1 *)(in_RDI + 0x2aa) = 1;
  }
  return;
}

Assistant:

void
keyboard_default(struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
    kUnused(mod);
    kUnused(isPressed);
    if (key == KB_KEY_ESCAPE) {
        SWindowData *window_data = (SWindowData *) window;
        if (!window_data->close_func || window_data->close_func((struct mfb_window*)window_data)) {
            window_data->close = true;
        }
    }
}